

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

string * __thiscall
util_tests::SpanToStr_abi_cxx11_
          (string *__return_storage_ptr__,util_tests *this,Span<const_char> *span)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)this;
  lVar3 = *(long *)(this + 8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::string::_M_construct<char_const*>();
    return __return_storage_ptr__;
  }
  __stack_chk_fail(__return_storage_ptr__,lVar2,lVar3 + lVar2);
}

Assistant:

static std::string SpanToStr(const Span<const char>& span)
{
    return std::string(span.begin(), span.end());
}